

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.h
# Opt level: O3

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::shiftUBbound(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *this,int i,
              number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *to)

{
  pointer pnVar1;
  int32_t iVar2;
  int iVar3;
  cpp_dec_float<200U,_int,_void> *pcVar4;
  long lVar5;
  uint *puVar6;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar7;
  cpp_dec_float<200U,_int,_void> *pcVar8;
  pointer pnVar9;
  byte bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_128;
  cpp_dec_float<200U,_int,_void> local_a8;
  
  bVar10 = 0;
  pcVar4 = &(this->theUBbound).val.
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
  local_a8.fpclass = cpp_dec_float_finite;
  local_a8.prec_elem = 0x1c;
  local_a8.data._M_elems[0] = 0;
  local_a8.data._M_elems[1] = 0;
  local_a8.data._M_elems[2] = 0;
  local_a8.data._M_elems[3] = 0;
  local_a8.data._M_elems[4] = 0;
  local_a8.data._M_elems[5] = 0;
  local_a8.data._M_elems[6] = 0;
  local_a8.data._M_elems[7] = 0;
  local_a8.data._M_elems[8] = 0;
  local_a8.data._M_elems[9] = 0;
  local_a8.data._M_elems[10] = 0;
  local_a8.data._M_elems[0xb] = 0;
  local_a8.data._M_elems[0xc] = 0;
  local_a8.data._M_elems[0xd] = 0;
  local_a8.data._M_elems[0xe] = 0;
  local_a8.data._M_elems[0xf] = 0;
  local_a8.data._M_elems[0x10] = 0;
  local_a8.data._M_elems[0x11] = 0;
  local_a8.data._M_elems[0x12] = 0;
  local_a8.data._M_elems[0x13] = 0;
  local_a8.data._M_elems[0x14] = 0;
  local_a8.data._M_elems[0x15] = 0;
  local_a8.data._M_elems[0x16] = 0;
  local_a8.data._M_elems[0x17] = 0;
  local_a8.data._M_elems[0x18] = 0;
  local_a8.data._M_elems[0x19] = 0;
  local_a8.data._M_elems._104_5_ = 0;
  local_a8.data._M_elems[0x1b]._1_3_ = 0;
  local_a8.exp = 0;
  local_a8.neg = false;
  if (&local_a8 == pcVar4) {
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (&local_a8,&to->m_backend);
    if (local_a8.data._M_elems[0] != 0 || local_a8.fpclass != cpp_dec_float_finite) {
      local_a8.neg = (bool)(local_a8.neg ^ 1);
      goto LAB_0051a993;
    }
LAB_0051a9a1:
    local_128.fpclass = cpp_dec_float_finite;
    local_128.prec_elem = 0x1c;
    local_128.data._M_elems[0] = 0;
    local_128.data._M_elems[1] = 0;
    local_128.data._M_elems[2] = 0;
    local_128.data._M_elems[3] = 0;
    local_128.data._M_elems[4] = 0;
    local_128.data._M_elems[5] = 0;
    local_128.data._M_elems[6] = 0;
    local_128.data._M_elems[7] = 0;
    local_128.data._M_elems[8] = 0;
    local_128.data._M_elems[9] = 0;
    local_128.data._M_elems[10] = 0;
    local_128.data._M_elems[0xb] = 0;
    local_128.data._M_elems[0xc] = 0;
    local_128.data._M_elems[0xd] = 0;
    local_128.data._M_elems[0xe] = 0;
    local_128.data._M_elems[0xf] = 0;
    local_128.data._M_elems[0x10] = 0;
    local_128.data._M_elems[0x11] = 0;
    local_128.data._M_elems[0x12] = 0;
    local_128.data._M_elems[0x13] = 0;
    local_128.data._M_elems[0x14] = 0;
    local_128.data._M_elems[0x15] = 0;
    local_128.data._M_elems[0x16] = 0;
    local_128.data._M_elems[0x17] = 0;
    local_128.data._M_elems[0x18] = 0;
    local_128.data._M_elems[0x19] = 0;
    local_128.data._M_elems._104_5_ = 0;
    local_128.data._M_elems[0x1b]._1_3_ = 0;
    local_128.exp = 0;
    local_128.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_128,0.0);
    iVar3 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                      (&local_a8,&local_128);
    if (0 < iVar3) {
      pcVar4 = &(this->theUBbound).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start[i].m_backend;
      local_128.fpclass = cpp_dec_float_finite;
      local_128.prec_elem = 0x1c;
      local_128.data._M_elems[0] = 0;
      local_128.data._M_elems[1] = 0;
      local_128.data._M_elems[2] = 0;
      local_128.data._M_elems[3] = 0;
      local_128.data._M_elems[4] = 0;
      local_128.data._M_elems[5] = 0;
      local_128.data._M_elems[6] = 0;
      local_128.data._M_elems[7] = 0;
      local_128.data._M_elems[8] = 0;
      local_128.data._M_elems[9] = 0;
      local_128.data._M_elems[10] = 0;
      local_128.data._M_elems[0xb] = 0;
      local_128.data._M_elems[0xc] = 0;
      local_128.data._M_elems[0xd] = 0;
      local_128.data._M_elems[0xe] = 0;
      local_128.data._M_elems[0xf] = 0;
      local_128.data._M_elems[0x10] = 0;
      local_128.data._M_elems[0x11] = 0;
      local_128.data._M_elems[0x12] = 0;
      local_128.data._M_elems[0x13] = 0;
      local_128.data._M_elems[0x14] = 0;
      local_128.data._M_elems[0x15] = 0;
      local_128.data._M_elems[0x16] = 0;
      local_128.data._M_elems[0x17] = 0;
      local_128.data._M_elems[0x18] = 0;
      local_128.data._M_elems[0x19] = 0;
      local_128.data._M_elems._104_5_ = 0;
      local_128.data._M_elems[0x1b]._1_3_ = 0;
      local_128.exp = 0;
      local_128.neg = false;
      if (&local_128 == pcVar4) {
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_128,&to->m_backend);
        if (local_128.data._M_elems[0] != 0 || local_128.fpclass != cpp_dec_float_finite) {
          local_128.neg = (bool)(local_128.neg ^ 1);
        }
      }
      else {
        if (&local_128 != &to->m_backend) {
          pnVar7 = to;
          pcVar8 = &local_128;
          for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
            *(uint *)pcVar8 = (pnVar7->m_backend).data._M_elems[0];
            pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar7 + ((ulong)bVar10 * -2 + 1) * 4);
            pcVar8 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar8 + ((ulong)bVar10 * -2 + 1) * 4)
            ;
          }
          local_128.exp = (to->m_backend).exp;
          local_128.neg = (to->m_backend).neg;
          local_128.fpclass = (to->m_backend).fpclass;
          local_128.prec_elem = (to->m_backend).prec_elem;
        }
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
                  (&local_128,pcVar4);
      }
      goto LAB_0051aac4;
    }
  }
  else {
    if (&local_a8 != &to->m_backend) {
      puVar6 = (uint *)to;
      pcVar8 = &local_a8;
      for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
        (pcVar8->data)._M_elems[0] = *puVar6;
        puVar6 = puVar6 + 1;
        pcVar8 = (cpp_dec_float<200U,_int,_void> *)((pcVar8->data)._M_elems + 1);
      }
      local_a8.exp = (to->m_backend).exp;
      local_a8.neg = (to->m_backend).neg;
      local_a8.fpclass = (to->m_backend).fpclass;
      local_a8.prec_elem = (to->m_backend).prec_elem;
    }
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=(&local_a8,pcVar4);
LAB_0051a993:
    if (local_a8.fpclass != cpp_dec_float_NaN) goto LAB_0051a9a1;
  }
  local_128.fpclass = cpp_dec_float_finite;
  local_128.prec_elem = 0x1c;
  local_128.data._M_elems[0] = 0;
  local_128.data._M_elems[1] = 0;
  local_128.data._M_elems[2] = 0;
  local_128.data._M_elems[3] = 0;
  local_128.data._M_elems[4] = 0;
  local_128.data._M_elems[5] = 0;
  local_128.data._M_elems[6] = 0;
  local_128.data._M_elems[7] = 0;
  local_128.data._M_elems[8] = 0;
  local_128.data._M_elems[9] = 0;
  local_128.data._M_elems[10] = 0;
  local_128.data._M_elems[0xb] = 0;
  local_128.data._M_elems[0xc] = 0;
  local_128.data._M_elems[0xd] = 0;
  local_128.data._M_elems[0xe] = 0;
  local_128.data._M_elems[0xf] = 0;
  local_128.data._M_elems[0x10] = 0;
  local_128.data._M_elems[0x11] = 0;
  local_128.data._M_elems[0x12] = 0;
  local_128.data._M_elems[0x13] = 0;
  local_128.data._M_elems[0x14] = 0;
  local_128.data._M_elems[0x15] = 0;
  local_128.data._M_elems[0x16] = 0;
  local_128.data._M_elems[0x17] = 0;
  local_128.data._M_elems[0x18] = 0;
  local_128.data._M_elems[0x19] = 0;
  local_128.data._M_elems._104_5_ = 0;
  local_128.data._M_elems[0x1b]._1_3_ = 0;
  local_128.exp = 0;
  local_128.neg = false;
  boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
            ((cpp_dec_float<200u,int,void> *)&local_128,0.0);
LAB_0051aac4:
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator+=
            (&(this->theShift).m_backend,&local_128);
  pnVar1 = (this->theUBbound).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pnVar7 = to;
  pnVar9 = pnVar1 + i;
  for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
    (pnVar9->m_backend).data._M_elems[0] = (pnVar7->m_backend).data._M_elems[0];
    pnVar7 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              *)((long)pnVar7 + ((ulong)bVar10 * -2 + 1) * 4);
    pnVar9 = (pointer)((long)pnVar9 + ((ulong)bVar10 * -2 + 1) * 4);
  }
  pnVar1[i].m_backend.exp = (to->m_backend).exp;
  pnVar1[i].m_backend.neg = (to->m_backend).neg;
  iVar2 = (to->m_backend).prec_elem;
  pnVar1[i].m_backend.fpclass = (to->m_backend).fpclass;
  pnVar1[i].m_backend.prec_elem = iVar2;
  return;
}

Assistant:

void shiftUBbound(int i, R to)
   {
      assert(theType == ENTER);
      // use maximum to not count tightened bounds in case of equality shifts
      theShift += SOPLEX_MAX(to - theUBbound[i], 0.0);
      theUBbound[i] = to;
   }